

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

void sort_rec2(int *array,int size)

{
  int iVar1;
  int iVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  int tmp;
  int pivot;
  int size_local;
  int *array_local;
  
  if (size < 0x10) {
    selectionsort2(array,size);
  }
  else {
    iVar1 = array[size / 2];
    local_20 = -1;
    local_24 = size;
    while( true ) {
      do {
        local_20 = local_20 + 1;
      } while (array[local_20] < iVar1);
      do {
        local_24 = local_24 + -1;
      } while (iVar1 < array[local_24]);
      if (local_24 <= local_20) break;
      iVar2 = array[local_20];
      array[local_20] = array[local_24];
      array[local_24] = iVar2;
    }
    sort_rec2(array,local_20);
    sort_rec2(array + local_20,size - local_20);
  }
  return;
}

Assistant:

static void sort_rec2(int* array, int size)
{
    if (size <= 15)
        selectionsort2(array, size);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec2(array    , i     );
        sort_rec2(&array[i], size-i);
    }
}